

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_node_free(lys_node *node,_func_void_lys_node_ptr_void_ptr *private_destructor,int shallow)

{
  LYS_NODE LVar1;
  ly_ctx *ctx_00;
  lys_node *plVar2;
  lys_node *next;
  lys_node *sub;
  ly_ctx *ctx;
  int shallow_local;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  lys_node *node_local;
  
  if (node == (lys_node *)0x0) {
    return;
  }
  if (node->module == (lys_module *)0x0) {
    __assert_fail("node->module",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0xad0,
                  "void lys_node_free(struct lys_node *, void (*)(const struct lys_node *, void *), int)"
                 );
  }
  if (node->module->ctx == (ly_ctx *)0x0) {
    __assert_fail("node->module->ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0xad1,
                  "void lys_node_free(struct lys_node *, void (*)(const struct lys_node *, void *), int)"
                 );
  }
  ctx_00 = node->module->ctx;
  if ((node->priv != (void *)0x0) && (private_destructor != (_func_void_lys_node_ptr_void_ptr *)0x0)
     ) {
    (*private_destructor)(node,node->priv);
  }
  lydict_remove(ctx_00,node->name);
  if ((node->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
    lys_iffeature_free(ctx_00,node->iffeature,node->iffeature_size,shallow,private_destructor);
    lydict_remove(ctx_00,node->dsc);
    lydict_remove(ctx_00,node->ref);
  }
  if ((shallow == 0) && ((node->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) {
    next = node->child;
    while (next != (lys_node *)0x0) {
      plVar2 = next->next;
      lys_node_free(next,private_destructor,0);
      next = plVar2;
    }
  }
  lys_extension_instances_free(ctx_00,node->ext,(uint)node->ext_size,private_destructor);
  LVar1 = node->nodetype;
  if (LVar1 == LYS_UNKNOWN) {
LAB_0018b19f:
    ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
           ,0xb18);
    goto LAB_0018b1c5;
  }
  if (LVar1 == LYS_CONTAINER) {
    lys_container_free(ctx_00,(lys_node_container *)node,private_destructor);
    goto LAB_0018b1c5;
  }
  if (LVar1 == LYS_CHOICE) {
    lys_when_free(ctx_00,*(lys_when **)node->hash,private_destructor);
    goto LAB_0018b1c5;
  }
  if (LVar1 == LYS_LEAF) {
    lys_leaf_free(ctx_00,(lys_node_leaf *)node,private_destructor);
    goto LAB_0018b1c5;
  }
  if (LVar1 == LYS_LEAFLIST) {
    lys_leaflist_free(ctx_00,(lys_node_leaflist *)node,private_destructor);
    goto LAB_0018b1c5;
  }
  if (LVar1 == LYS_LIST) {
    lys_list_free(ctx_00,(lys_node_list *)node,private_destructor);
    goto LAB_0018b1c5;
  }
  if (LVar1 == LYS_ANYXML) {
LAB_0018b10e:
    lys_anydata_free(ctx_00,(lys_node_anydata *)node,private_destructor);
  }
  else {
    if (LVar1 == LYS_CASE) {
      lys_when_free(ctx_00,*(lys_when **)node->hash,private_destructor);
      goto LAB_0018b1c5;
    }
    if (LVar1 == LYS_NOTIF) {
      lys_notif_free(ctx_00,(lys_node_notif *)node,private_destructor);
      goto LAB_0018b1c5;
    }
    if (LVar1 != LYS_RPC) {
      if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) {
        lys_inout_free(ctx_00,(lys_node_inout *)node,private_destructor);
        goto LAB_0018b1c5;
      }
      if (LVar1 == LYS_GROUPING) {
        lys_grp_free(ctx_00,(lys_node_grp *)node,private_destructor);
        goto LAB_0018b1c5;
      }
      if (LVar1 == LYS_USES) {
        lys_uses_free(ctx_00,(lys_node_uses *)node,private_destructor);
        goto LAB_0018b1c5;
      }
      if (LVar1 == LYS_AUGMENT) goto LAB_0018b1c5;
      if (LVar1 != LYS_ACTION) {
        if (LVar1 != LYS_ANYDATA) {
          if (LVar1 != LYS_EXT) goto LAB_0018b1c5;
          goto LAB_0018b19f;
        }
        goto LAB_0018b10e;
      }
    }
    lys_rpc_action_free(ctx_00,(lys_node_rpc_action *)node,private_destructor);
  }
LAB_0018b1c5:
  lys_node_unlink(node);
  free(node);
  return;
}

Assistant:

void
lys_node_free(struct lys_node *node, void (*private_destructor)(const struct lys_node *node, void *priv), int shallow)
{
    struct ly_ctx *ctx;
    struct lys_node *sub, *next;

    if (!node) {
        return;
    }

    assert(node->module);
    assert(node->module->ctx);

    ctx = node->module->ctx;

    /* remove private object */
    if (node->priv && private_destructor) {
        private_destructor(node, node->priv);
    }

    /* common part */
    lydict_remove(ctx, node->name);
    if (!(node->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
        lys_iffeature_free(ctx, node->iffeature, node->iffeature_size, shallow, private_destructor);
        lydict_remove(ctx, node->dsc);
        lydict_remove(ctx, node->ref);
    }

    if (!shallow && !(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        LY_TREE_FOR_SAFE(node->child, next, sub) {
            lys_node_free(sub, private_destructor, 0);
        }
    }

    lys_extension_instances_free(ctx, node->ext, node->ext_size, private_destructor);

    /* specific part */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        lys_container_free(ctx, (struct lys_node_container *)node, private_destructor);
        break;
    case LYS_CHOICE:
        lys_when_free(ctx, ((struct lys_node_choice *)node)->when, private_destructor);
        break;
    case LYS_LEAF:
        lys_leaf_free(ctx, (struct lys_node_leaf *)node, private_destructor);
        break;
    case LYS_LEAFLIST:
        lys_leaflist_free(ctx, (struct lys_node_leaflist *)node, private_destructor);
        break;
    case LYS_LIST:
        lys_list_free(ctx, (struct lys_node_list *)node, private_destructor);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        lys_anydata_free(ctx, (struct lys_node_anydata *)node, private_destructor);
        break;
    case LYS_USES:
        lys_uses_free(ctx, (struct lys_node_uses *)node, private_destructor);
        break;
    case LYS_CASE:
        lys_when_free(ctx, ((struct lys_node_case *)node)->when, private_destructor);
        break;
    case LYS_AUGMENT:
        /* do nothing */
        break;
    case LYS_GROUPING:
        lys_grp_free(ctx, (struct lys_node_grp *)node, private_destructor);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        lys_rpc_action_free(ctx, (struct lys_node_rpc_action *)node, private_destructor);
        break;
    case LYS_NOTIF:
        lys_notif_free(ctx, (struct lys_node_notif *)node, private_destructor);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        lys_inout_free(ctx, (struct lys_node_inout *)node, private_destructor);
        break;
    case LYS_EXT:
    case LYS_UNKNOWN:
        LOGINT(ctx);
        break;
    }

    /* again common part */
    lys_node_unlink(node);
    free(node);
}